

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O3

QUntypedPropertyBinding __thiscall
QtPrivate::PropertyAdaptorSlotObjectHelpers::getBinding
          (PropertyAdaptorSlotObjectHelpers *this,QUntypedPropertyData *d)

{
  QUntypedPropertyData *pQVar1;
  
  pQVar1 = (QUntypedPropertyData *)(*(ulong *)(d + 0x10) & 0xfffffffffffffffc);
  if ((*(ulong *)(d + 0x10) & 2) == 0) {
    pQVar1 = d + 0x10;
  }
  QUntypedPropertyBinding::QUntypedPropertyBinding
            ((QUntypedPropertyBinding *)this,
             (QPropertyBindingPrivate *)(*(long *)pQVar1 - 1U & -(ulong)((uint)*(long *)pQVar1 & 1))
            );
  return (QUntypedPropertyBinding)(QPropertyBindingPrivatePtr)this;
}

Assistant:

QUntypedPropertyBinding getBinding(const QUntypedPropertyData *d)
{
    auto adaptor = static_cast<const QtPrivate::QPropertyAdaptorSlotObject *>(d);
    return QUntypedPropertyBinding(adaptor->bindingData().binding());
}